

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_resampler.cpp
# Opt level: O2

void __thiscall crnlib::Resampler::resample_x(Resampler *this,Sample *Pdst,Sample *Psrc)

{
  Contrib_List *pCVar1;
  int iVar2;
  uint uVar3;
  unsigned_short *puVar4;
  float fVar5;
  
  pCVar1 = this->m_Pclist_x;
  for (iVar2 = this->m_resample_dst_x; 0 < iVar2; iVar2 = iVar2 + -1) {
    puVar4 = &pCVar1->p->pixel;
    fVar5 = 0.0;
    for (uVar3 = (uint)pCVar1->n; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
      fVar5 = fVar5 + Psrc[*puVar4] * ((Contrib *)(puVar4 + -2))->weight;
      puVar4 = puVar4 + 4;
    }
    *Pdst = fVar5;
    Pdst = Pdst + 1;
    pCVar1 = pCVar1 + 1;
  }
  return;
}

Assistant:

void Resampler::resample_x(Sample* Pdst, const Sample* Psrc)
    {
        resampler_assert(Pdst);
        resampler_assert(Psrc);

        int i, j;
        Sample total;
        Contrib_List* Pclist = m_Pclist_x;
        Contrib* p;

        for (i = m_resample_dst_x; i > 0; i--, Pclist++)
        {
#if CRNLIB_RESAMPLER_DEBUG_OPS
            total_ops += Pclist->n;
#endif

            for (j = Pclist->n, p = Pclist->p, total = 0; j > 0; j--, p++)
            {
                total += Psrc[p->pixel] * p->weight;
            }

            *Pdst++ = total;
        }
    }